

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O1

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  bool bVar4;
  LayerUnion LVar5;
  LogMessage *other;
  long lVar6;
  long *plVar7;
  undefined8 *puVar8;
  size_type *psVar9;
  Result *_result;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  uint64 uVar12;
  string err_1;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_68 [56];
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  paVar1 = &(__return_storage_ptr__->m_message).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  validateOutputCount(__return_storage_ptr__,layer,2,-1);
  bVar4 = Result::good(__return_storage_ptr__);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  pcVar2 = (__return_storage_ptr__->m_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  if (layer->_oneof_case_[0] == 0x3cf) {
    LVar5 = layer->layer_;
  }
  else {
    LVar5.splitnd_ = Specification::SplitNDLayerParams::default_instance();
  }
  uVar12 = (uint64)((LVar5.convolution_)->kernelsize_).current_size_;
  if ((long)uVar12 < 1) {
    uVar12 = (LVar5.batchnorm_)->channels_;
  }
  if (uVar12 == 0) {
    std::operator+(&local_a8,"Either split_sizes or num_splits should be provided for \'",
                   (layer->name_).ptr_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_a8);
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_68._16_8_ = *psVar9;
      local_68._24_8_ = plVar7[3];
      local_68._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_68 + 0x10);
    }
    else {
      local_68._16_8_ = *psVar9;
      local_68._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_68._8_8_ = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_68);
    uVar10 = local_68._16_8_;
    _Var11._M_p = (pointer)local_68._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_68 + 0x10)) {
      return __return_storage_ptr__;
    }
    goto LAB_0031a827;
  }
  if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
LAB_0031a60e:
    if (uVar12 == (long)(layer->output_).super_RepeatedPtrFieldBase.current_size_) {
      Result::Result(__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    std::operator+(&local_88,"Value of num_splits should match size of output names for \'",
                   (layer->name_).ptr_);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_88);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    psVar9 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_a8.field_2._M_allocated_capacity = *psVar9;
      local_a8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar9;
      local_a8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_a8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a8);
  }
  else {
    if ((layer->inputtensor_).super_RepeatedPtrFieldBase.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x5c6);
      other = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,other);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_68);
    }
    lVar6 = (long)*(int *)((long)((layer->inputtensor_).super_RepeatedPtrFieldBase.rep_)->elements
                                 [0] + 0x24);
    lVar3 = (LVar5.splitnd_)->axis_;
    if ((SBORROW8(lVar3,-lVar6) == lVar3 + lVar6 < 0) && (lVar3 < lVar6)) goto LAB_0031a60e;
    std::operator+(&local_88,
                   "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'",
                   (layer->name_).ptr_);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&local_88);
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    psVar9 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_a8.field_2._M_allocated_capacity = *psVar9;
      local_a8.field_2._8_8_ = puVar8[3];
    }
    else {
      local_a8.field_2._M_allocated_capacity = *psVar9;
      local_a8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_a8._M_string_length = puVar8[1];
    *puVar8 = psVar9;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&local_a8);
  }
  uVar10 = local_a8.field_2._M_allocated_capacity;
  _Var11._M_p = local_a8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
    return __return_storage_ptr__;
  }
LAB_0031a827:
  operator_delete(_Var11._M_p,uVar10 + 1);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitNDLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    size_t numSplits = 0;
    const auto& params = layer.splitnd();

    if (params.splitsizes_size() > 0) {
        numSplits = static_cast<size_t>(params.splitsizes_size());
    } else {
        numSplits = static_cast<size_t>(params.numsplits());
    }
    if (numSplits == 0) {
        const std::string err = "Either split_sizes or num_splits should be provided for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    if (numSplits != static_cast<size_t>(layer.output_size())) {
        const std::string err = "Value of num_splits should match size of output names for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}